

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# corealloc.h
# Opt level: O3

void __thiscall
snmalloc::Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>_>::
dealloc_remote_slow<snmalloc::CheckInitPthread>
          (Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>_> *this,
          PagemapEntry *entry,Alloc<void> p)

{
  Builder<false,_true,_snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)1>,_snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)0>_>
  *pBVar1;
  Array<uint16_t,_false___2_:_(true___1_:_0)> *pAVar2;
  ushort uVar3;
  Array<void_*,_LENGTH> AVar4;
  void **ppvVar5;
  bool bVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  unsigned_long *puVar10;
  ushort uVar11;
  uint uVar12;
  ulong uVar13;
  long lVar14;
  long *in_FS_OFFSET;
  bool bVar15;
  
  if ((Alloc *)*in_FS_OFFSET == &ThreadAlloc::default_alloc) {
    ThreadAlloc::CheckInitBase<snmalloc::CheckInitPthread>::
    check_init_slow<snmalloc::Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>>::dealloc_remote_slow<snmalloc::CheckInitPthread>(snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>>const&,snmalloc::CapPtr<void,snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,(snmalloc::capptr::dimension::AddressSpaceControl)0,(snmalloc::capptr::dimension::Wildness)1>>)::_lambda(snmalloc::Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>>*,void*)_1_,void*>
              (p.unsafe_capptr);
    return;
  }
  uVar9 = (entry->
          super_FrontendMetaEntry<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>
          ).super_MetaEntryBase.meta;
  uVar7 = uVar9 & 0xfffffffffffffffe;
  if (p.unsafe_capptr != (void *)0x0) {
    *(undefined8 *)p.unsafe_capptr = 0;
  }
  uVar9 = (ulong)(((uint)(uVar9 >> 3) & 0x1fffffff) * 0x3352d >> 0x10 & 7);
  if (uVar7 != (this->remote_dealloc_cache).batching.open_meta._M_elems[uVar9]) {
    if (uVar7 != *(ulong *)((long)this->alloc_classes + uVar9 * 8 + -0x80)) {
      uVar11 = 0;
      lVar14 = 0;
      uVar8 = uVar9;
      bVar15 = true;
      do {
        bVar6 = bVar15;
        uVar13 = lVar14 + uVar9;
        if ((this->remote_dealloc_cache).batching.open_meta._M_elems[uVar13] == 0) {
          puVar10 = (this->remote_dealloc_cache).batching.open_meta._M_elems + uVar13;
          goto LAB_0010abef;
        }
        uVar3 = (this->remote_dealloc_cache).batching.open_builder._M_elems[uVar13].length._M_elems
                [0];
        bVar15 = uVar11 < uVar3;
        if (uVar11 <= uVar3) {
          uVar11 = uVar3;
        }
        if (bVar15) {
          uVar8 = uVar13;
        }
        lVar14 = 1;
        bVar15 = false;
      } while (bVar6);
      puVar10 = (this->remote_dealloc_cache).batching.open_meta._M_elems + uVar8;
      uVar13 = uVar8;
      if (*puVar10 != 0) {
        pBVar1 = (this->remote_dealloc_cache).batching.open_builder._M_elems + uVar8;
        uVar11 = (pBVar1->length)._M_elems[0];
        AVar4._M_elems[0] = (_Type)(pBVar1->head)._M_elems[0];
        ppvVar5 = (pBVar1->end)._M_elems[0];
        (pBVar1->end)._M_elems[0] = (void **)pBVar1;
        (pBVar1->length)._M_elems[0] = 0;
        if (ppvVar5 != (void **)0x0) {
          ppvVar5[1] = (void *)0x0;
        }
        *ppvVar5 = (void *)(((long)AVar4._M_elems[0] - (long)ppvVar5) * 0x800 + (ulong)uVar11);
        uVar12 = *(uint *)((long)&((BasicPagemap<snmalloc::PALLinux,_snmalloc::FlatPagemap<14UL,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_snmalloc::PALLinux,_false>,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_false>
                                    ::concretePagemap.body)->
                                  super_FrontendMetaEntry<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>
                                  ).super_MetaEntryBase.remote_and_sizeclass +
                          ((ulong)ppvVar5 >> 10 & 0xfffffffffffffff0)) >> 0xe & 0xff;
        *(this->remote_dealloc_cache).list._M_elems[uVar12].end._M_elems[0] = ppvVar5 + 1;
        (this->remote_dealloc_cache).list._M_elems[uVar12].end._M_elems[0] = ppvVar5 + 1;
        *puVar10 = 0;
      }
LAB_0010abef:
      *puVar10 = uVar7;
      (this->remote_dealloc_cache).batching.open_builder._M_elems[uVar13].head._M_elems[0] =
           p.unsafe_capptr;
      (this->remote_dealloc_cache).batching.open_builder._M_elems[uVar13].end._M_elems[0] =
           (void **)p.unsafe_capptr;
      (this->remote_dealloc_cache).batching.open_builder._M_elems[uVar13].length._M_elems[0] = 1;
      goto LAB_0010ac07;
    }
    uVar9 = uVar9 + 1;
  }
  *(this->remote_dealloc_cache).batching.open_builder._M_elems[uVar9].end._M_elems[0] =
       p.unsafe_capptr;
  (this->remote_dealloc_cache).batching.open_builder._M_elems[uVar9].end._M_elems[0] =
       (void **)p.unsafe_capptr;
  pAVar2 = &(this->remote_dealloc_cache).batching.open_builder._M_elems[uVar9].length;
  pAVar2->_M_elems[0] = pAVar2->_M_elems[0] + 1;
LAB_0010ac07:
  RemoteDeallocCache<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>>::
  post<9216ul>((RemoteDeallocCache<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>>
                *)&this->remote_dealloc_cache,&this->backend_state,(alloc_id_t)&this->remote_alloc);
  return;
}

Assistant:

SNMALLOC_SLOW_PATH void
    dealloc_remote_slow(const PagemapEntry& entry, capptr::Alloc<void> p)
    {
      CheckInit::check_init(
        [this, &entry, p]() SNMALLOC_FAST_PATH_LAMBDA {
#ifdef SNMALLOC_TRACING
          message<1024>(
            "Remote dealloc post {} ({}, {})",
            p.unsafe_ptr(),
            sizeclass_full_to_size(entry.get_sizeclass()),
            address_cast(entry.get_slab_metadata()));
#endif
          remote_dealloc_cache.template dealloc<sizeof(Allocator)>(
            entry.get_slab_metadata(), p, &entropy);

          post();
        },
        [](Allocator* a, void* p) {
          // Recheck what kind of dealloc we should do in case the allocator
          // we get from lazy_init is the originating allocator.
          a->dealloc(p); // TODO don't double count statistics
        },
        p.unsafe_ptr());
    }